

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f * Matrix4f::translation(Matrix4f *__return_storage_ptr__,Vector3f *rTranslation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = Vector3f::x(rTranslation);
  fVar2 = Vector3f::y(rTranslation);
  fVar3 = Vector3f::z(rTranslation);
  __return_storage_ptr__->m_elements[0] = 1.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 1.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 1.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = fVar1;
  __return_storage_ptr__->m_elements[0xd] = fVar2;
  __return_storage_ptr__->m_elements[0xe] = fVar3;
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::translation( const Vector3f& rTranslation )
{
	return Matrix4f
	(
		1, 0, 0, rTranslation.x(),
		0, 1, 0, rTranslation.y(),
		0, 0, 1, rTranslation.z(),
		0, 0, 0, 1
	);
}